

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  ostream *poVar1;
  ostream *this_00;
  uint uVar2;
  int iVar3;
  stringstream *this_01;
  size_t sVar4;
  stringstream *this_02;
  CapturedStream **in_RDX;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  regmatch_t match;
  string error_message;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream_abi_cxx11_(&local_70,(internal *)&g_captured_stderr,in_RDX);
  this_01 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_01);
  poVar1 = (ostream *)(this_01 + 0x10);
  *(undefined8 *)(this_01 + *(long *)(*(long *)(this_01 + 0x10) + -0x18) + 0x18) = 0x11;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Death test: ",0xc);
  pcVar7 = this->statement_;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "(null)";
    sVar4 = 6;
  }
  else {
    sVar4 = strlen(pcVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      if (this->regex_[8] == (RE)0x1) {
        iVar3 = regexec((regex_t *)(this->regex_ + 0x50),local_70._M_dataplus._M_p,1,
                        (regmatch_t *)&local_90,0);
        bVar8 = iVar3 == 0;
      }
      else {
        bVar8 = false;
      }
      if (bVar8 == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"    Result: died but not with expected error.\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  Expected: ",0xc);
        pcVar7 = *(char **)this->regex_;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "(null)";
          sVar4 = 6;
        }
        else {
          sVar4 = strlen(pcVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
        FormatDeathTestOutput(&local_90,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      goto LAB_0020b918;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: died but not with expected exit code:\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            ",0xc);
    uVar2 = this->status_;
    this_02 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_02);
    this_00 = (ostream *)(this_02 + 0x10);
    *(undefined8 *)(this_02 + *(long *)(*(long *)(this_02 + 0x10) + -0x18) + 0x18) = 0x11;
    uVar6 = uVar2 & 0x7f;
    if (uVar6 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Exited with exit status ",0x18);
      uVar6 = uVar2 >> 8 & 0xff;
LAB_0020ba7c:
      std::ostream::operator<<((ostream *)this_00,uVar6);
    }
    else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Terminated by signal ",0x15);
      goto LAB_0020ba7c;
    }
    if ((char)uVar2 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(this_00," (core dumped)",0xe);
    }
    StringStreamToString(&local_90,(stringstream *)this_02);
    (**(code **)(*(long *)this_02 + 8))(this_02);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_50,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_0020b8cc;
  case LIVED:
    pcVar7 = "    Result: failed to die.\n";
    lVar5 = 0x1b;
    break;
  case RETURNED:
    pcVar7 = "    Result: illegal return in test statement.\n";
    lVar5 = 0x2e;
    break;
  case THREW:
    pcVar7 = "    Result: threw an exception.\n";
    lVar5 = 0x20;
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                       ,0x248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_90);
    goto LAB_0020b916;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
  FormatDeathTestOutput(&local_90,&local_70);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_0020b8cc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
LAB_0020b916:
  bVar8 = false;
LAB_0020b918:
  StringStreamToString(&local_90,(stringstream *)this_01);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (**(code **)(*(long *)this_01 + 8))(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
# if GTEST_USES_PCRE
        // PCRE regexes support embedded NULs.
        // GTEST_USES_PCRE is defined only in google3 mode
        const bool matched = RE::PartialMatch(error_message, *regex());
# else
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
# endif  // GTEST_USES_PCRE
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}